

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferOperationsViaImageStore::deinit(TextureBufferOperationsViaImageStore *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TextureBufferOperations).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  if (this->m_is_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_is_po_id = 0;
  }
  if (this->m_is_cs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_is_cs_id = 0;
  }
  TextureBufferOperations::deinit(&this->super_TextureBufferOperations);
  return;
}

Assistant:

void TextureBufferOperationsViaImageStore::deinit(void)
{
	/* Get Gl entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.useProgram(0);

	/* Delete GLES objects */
	if (0 != m_is_po_id)
	{
		gl.deleteProgram(m_is_po_id);
		m_is_po_id = 0;
	}

	if (0 != m_is_cs_id)
	{
		gl.deleteShader(m_is_cs_id);
		m_is_cs_id = 0;
	}

	/* Deinitalize base class */
	TextureBufferOperations::deinit();
}